

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wait_strategy.h
# Opt level: O2

int64_t __thiscall
disruptor::SleepingStrategy<200L,_std::chrono::duration<long,_std::ratio<1L,_1000L>_>,_1>::
ApplyWaitMethod(SleepingStrategy<200L,_std::chrono::duration<long,_std::ratio<1L,_1000L>_>,_1> *this
               ,int64_t counter)

{
  duration<long,_std::ratio<1L,_1000L>_> local_10;
  
  if (counter < 0x65) {
    if (counter < 1) {
      local_10.__r = 1;
      std::this_thread::sleep_for<long,std::ratio<1l,1000l>>(&local_10);
    }
    else {
      counter = counter + -1;
      sched_yield();
    }
  }
  else {
    counter = counter + -1;
  }
  return counter;
}

Assistant:

inline int64_t ApplyWaitMethod(int64_t counter) {
    if (counter > (S / 2)) {
      SpinPause();
      --counter;
    } else if (counter > 0) {
      --counter;
      std::this_thread::yield();
    } else {
      std::this_thread::sleep_for(D(DV));
    }

    return counter;
  }